

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_functionApply
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t functionOperand,
               size_t argumentCount,int16_t *argumentOperands,int applicationFlags)

{
  sysbvm_tuple_t sVar1;
  sysbvm_function_t *psVar2;
  _Bool _Var3;
  uint32_t primitiveNumber_00;
  sysbvm_functionEntryPoint_t calledFunctionPointer;
  void *calledFunctionPointer_00;
  void *trampolineOrEntryPoint;
  sysbvm_functionDefinition_t *literalFunctionDefinitionObject;
  sysbvm_functionEntryPoint_t entryPoint;
  uint32_t primitiveNumber;
  sysbvm_function_t *literalFunctionObject;
  sysbvm_tuple_t literalFunction;
  _Bool isNoTypecheck;
  int16_t *piStack_28;
  int applicationFlags_local;
  int16_t *argumentOperands_local;
  size_t argumentCount_local;
  int16_t functionOperand_local;
  sysbvm_bytecodeJit_t *psStack_10;
  int16_t resultOperand_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  literalFunction._3_1_ = (applicationFlags & 1U) != 0;
  literalFunctionObject = (sysbvm_function_t *)0x0;
  literalFunction._4_4_ = applicationFlags;
  piStack_28 = argumentOperands;
  argumentOperands_local = (int16_t *)argumentCount;
  argumentCount_local._4_2_ = functionOperand;
  argumentCount_local._6_2_ = resultOperand;
  psStack_10 = jit;
  if (((((bool)literalFunction._3_1_) &&
       (_Var3 = sysbvm_bytecodeJit_getLiteralValueForOperand
                          (jit,functionOperand,(sysbvm_tuple_t *)&literalFunctionObject), _Var3)) &&
      (_Var3 = sysbvm_tuple_isFunction(psStack_10->context,(sysbvm_tuple_t)literalFunctionObject),
      _Var3)) &&
     ((_Var3 = sysbvm_function_isMemoized(psStack_10->context,(sysbvm_tuple_t)literalFunctionObject)
      , !_Var3 &&
      (_Var3 = sysbvm_function_isVariadic(psStack_10->context,(sysbvm_tuple_t)literalFunctionObject)
      , psVar2 = literalFunctionObject, !_Var3)))) {
    if (literalFunctionObject->primitiveTableIndex != 0) {
      primitiveNumber_00 = sysbvm_tuple_uint32_decode(literalFunctionObject->primitiveTableIndex);
      calledFunctionPointer =
           sysbvm_function_getNumberedPrimitiveEntryPoint(psStack_10->context,primitiveNumber_00);
      if (calledFunctionPointer != (sysbvm_functionEntryPoint_t)0x0) {
        sysbvm_jit_functionApplyDirectWithArgumentsRecord
                  (psStack_10,argumentCount_local._6_2_,argumentCount_local._4_2_,
                   (size_t)argumentOperands_local,piStack_28,calledFunctionPointer);
        return;
      }
    }
    if (((psVar2->definition != 0) && (sVar1 = psVar2->definition, *(long *)(sVar1 + 0x80) != 0)) &&
       ((*(long *)(sVar1 + 0x80) != 0x5f &&
        (calledFunctionPointer_00 =
              sysbvm_jit_getTrampolineOrEntryPointForBytecode
                        (psStack_10,*(sysbvm_functionBytecode_t **)(sVar1 + 0x80)),
        calledFunctionPointer_00 != (void *)0x0)))) {
      sysbvm_jit_functionApplyDirectVia
                (psStack_10,argumentCount_local._6_2_,argumentCount_local._4_2_,
                 (size_t)argumentOperands_local,piStack_28,calledFunctionPointer_00);
      return;
    }
  }
  sysbvm_jit_functionApplyVia
            (psStack_10,argumentCount_local._6_2_,argumentCount_local._4_2_,
             (size_t)argumentOperands_local,piStack_28,literalFunction._4_4_,
             sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_functionApply(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t functionOperand, size_t argumentCount, int16_t *argumentOperands, int applicationFlags)
{
    bool isNoTypecheck = applicationFlags & SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK;

    // Are we calling a literal function?
    sysbvm_tuple_t literalFunction = SYSBVM_NULL_TUPLE;

    if(isNoTypecheck
        && sysbvm_bytecodeJit_getLiteralValueForOperand(jit, functionOperand, &literalFunction)
        && sysbvm_tuple_isFunction(jit->context, literalFunction)
        && !sysbvm_function_isMemoized(jit->context, literalFunction)
        && !sysbvm_function_isVariadic(jit->context, literalFunction))
    {
        // Is this a numbered primitive.
        sysbvm_function_t *literalFunctionObject = (sysbvm_function_t*)literalFunction;
        if(literalFunctionObject->primitiveTableIndex)
        {
            uint32_t primitiveNumber = sysbvm_tuple_uint32_decode(literalFunctionObject->primitiveTableIndex);
            sysbvm_functionEntryPoint_t entryPoint = sysbvm_function_getNumberedPrimitiveEntryPoint(jit->context, primitiveNumber);
            if(entryPoint)
            {
                sysbvm_jit_functionApplyDirectWithArgumentsRecord(jit, resultOperand, functionOperand, argumentCount, argumentOperands, entryPoint);
                return;
            }
        }
        
        if(literalFunctionObject->definition)
        {
            sysbvm_functionDefinition_t *literalFunctionDefinitionObject = (sysbvm_functionDefinition_t*)literalFunctionObject->definition;
            if(literalFunctionDefinitionObject->bytecode && literalFunctionDefinitionObject->bytecode != SYSBVM_PENDING_MEMOIZATION_VALUE)
            {
                void *trampolineOrEntryPoint = sysbvm_jit_getTrampolineOrEntryPointForBytecode(jit, (sysbvm_functionBytecode_t*)literalFunctionDefinitionObject->bytecode);
                if(trampolineOrEntryPoint)
                {
                    //printf("trampolineOrEntryPoint %p\n", trampolineOrEntryPoint);
                    sysbvm_jit_functionApplyDirectVia(jit, resultOperand, functionOperand, argumentCount, argumentOperands, trampolineOrEntryPoint);
                    return;
                }
            }
        }
    }

    sysbvm_jit_functionApplyVia(jit, resultOperand, functionOperand, argumentCount, argumentOperands, applicationFlags, &sysbvm_bytecodeInterpreter_functionApplyNoCopyArguments);
}